

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.h
# Opt level: O2

void UnitTest::_UnitTest_Compare::print(char *str)

{
  char *pcVar1;
  char *__ptr;
  ostream *poVar2;
  char *pcVar3;
  
  while( true ) {
    pcVar1 = strchr(str,10);
    if (pcVar1 == (char *)0x0) break;
    if ((long)pcVar1 - (long)str == 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,'\n');
      pcVar1 = _unittest_fail();
      std::operator<<(poVar2,pcVar1);
      if (DAT_00107178 == '\0') {
        std::operator<<((ostream *)&std::cout,anon_var_dwarf_3ad6);
      }
    }
    else {
      __ptr = strdup(str);
      __ptr[(long)pcVar1 - (long)str] = '\0';
      poVar2 = std::operator<<((ostream *)&std::cout,__ptr);
      poVar2 = std::operator<<(poVar2,'\n');
      pcVar3 = _unittest_fail();
      std::operator<<(poVar2,pcVar3);
      if (DAT_00107178 == '\0') {
        std::operator<<((ostream *)&std::cout,anon_var_dwarf_3ad6);
      }
      free(__ptr);
      str = pcVar1;
    }
    str = str + 1;
  }
  std::operator<<((ostream *)&std::cout,str);
  return;
}

Assistant:

static void print(const char *str) {
    const char *pos = 0;
    if (0 != (pos = std::strchr(str, '\n'))) {
      if (pos == str) {
        std::cout << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        print(&str[1]);
      } else {
        char *left = strdup(str);
        left[pos - str] = '\0';
        std::cout << left << '\n' << _unittest_fail();
        if (!global_unit_test_object_.vim_lines) {
          std::cout << "│ ";
        }
        free(left);
        print(&pos[1]);
      }
    } else {
      std::cout << str;
    }
  }